

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

void __thiscall
slang::TypedBumpAllocator<slang::ast::ConfigBlockSymbol>::~TypedBumpAllocator
          (TypedBumpAllocator<slang::ast::ConfigBlockSymbol> *this)

{
  ConfigBlockSymbol *in_RDI;
  ConfigBlockSymbol *cur;
  Segment *seg;
  Segment *local_18;
  Segment *local_10;
  
  for (local_10 = *(Segment **)&in_RDI->super_Symbol; local_10 != (Segment *)0x0;
      local_10 = local_10->prev) {
    for (local_18 = local_10 + 1; local_18 != (Segment *)local_10->current;
        local_18 = (Segment *)&local_18[0x13].current) {
      ast::ConfigBlockSymbol::~ConfigBlockSymbol(in_RDI);
    }
  }
  BumpAllocator::~BumpAllocator((BumpAllocator *)in_RDI);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }